

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BufferBindingTestCase::test
          (BufferBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum GVar1;
  allocator<char> local_dd;
  GLuint bufferObject;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  code *local_38;
  GLenum local_30;
  
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,0,
             (this->super_BindingTest).m_type);
  bufferObject = 0;
  glu::CallLogWrapper::glGenBuffers(gl,1,&bufferObject);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glGenBuffers");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  glu::CallLogWrapper::glBindBuffer(gl,this->m_bufferType,bufferObject);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,bufferObject,
             (this->super_BindingTest).m_type);
  glu::CallLogWrapper::glDeleteBuffers(gl,1,&bufferObject);
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Got Error ",&local_dd);
    local_38 = glu::getErrorName;
    local_30 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_d8,&local_38);
    std::operator+(&local_98,&local_b8,&local_d8);
    std::operator+(&local_78,&local_98,": ");
    std::operator+(&local_58,&local_78,"glDeleteBuffers");
    tcu::ResultCollector::fail(result,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,*(GLenum *)&(this->super_BindingTest).field_0x7c,0,
             (this->super_BindingTest).m_type);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		verifyStateInteger(result, gl, m_bufferBindingName, 0, m_type);

		GLuint bufferObject = 0;
		gl.glGenBuffers(1, &bufferObject);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGenBuffers");

		gl.glBindBuffer(m_bufferType, bufferObject);
		verifyStateInteger(result, gl, m_bufferBindingName, bufferObject, m_type);

		gl.glDeleteBuffers(1, &bufferObject);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteBuffers");

		verifyStateInteger(result, gl, m_bufferBindingName, 0, m_type);
	}